

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O1

bool jessilib::hex_shrink_sequence_action<char32_t,8ul,false,false>
               (char32_t **in_write_head,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> *read_view)

{
  size_t sVar1;
  char32_t *pcVar2;
  uint uVar3;
  char32_t cVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  sVar1 = read_view->_M_len;
  if (sVar1 == 0) {
    cVar4 = L'\0';
    lVar6 = 0;
  }
  else {
    uVar7 = 7;
    if (sVar1 - 1 < 7) {
      uVar7 = sVar1 - 1;
    }
    cVar4 = L'\0';
    lVar5 = 0;
    do {
      uVar8 = (ulong)(uint)read_view->_M_str[lVar5];
      uVar3 = 0xffffffff;
      if ((uVar8 < 0x80) && (uVar3 = (uint)(byte)base_table[uVar8], 0xf < uVar3)) {
        uVar3 = 0xffffffff;
      }
      lVar6 = lVar5;
      if ((int)uVar3 < 0) break;
      cVar4 = uVar3 | cVar4 << 4;
      lVar5 = lVar5 + 1;
      lVar6 = uVar7 + 1;
    } while (uVar7 + 1 != lVar5);
  }
  if (lVar6 != 0) {
    read_view->_M_str = read_view->_M_str + lVar6;
    read_view->_M_len = sVar1 - lVar6;
    pcVar2 = *in_write_head;
    *pcVar2 = cVar4;
    *in_write_head = pcVar2 + 1;
  }
  return lVar6 != 0;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}